

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmMemberAccess(ExpressionContext *ctx,VmModule *module,ExprMemberAccess *node)

{
  TypeBase *pTVar1;
  SynBase *source;
  VmValue *pVVar2;
  VmConstant *shift;
  TypeRef *structType;
  
  pVVar2 = CompileVm(ctx,module,node->value);
  pTVar1 = node->value->type;
  if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0x12)) {
    shift = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                              node->member->variable->offset);
    source = (node->super_ExprBase).source;
    structType = ExpressionContext::GetReferenceType(ctx,node->member->variable->type);
    pVVar2 = anon_unknown.dwarf_10d873::CreateMemberAccess
                       (module,source,pVVar2,&shift->super_VmValue,&structType->super_TypeBase,
                        node->member->variable->name->name);
    pVVar2 = anon_unknown.dwarf_10d873::CheckType(ctx,&node->super_ExprBase,pVVar2);
    return pVVar2;
  }
  __assert_fail("isType<TypeRef>(node->value->type)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xcf3,
                "VmValue *CompileVmMemberAccess(ExpressionContext &, VmModule *, ExprMemberAccess *)"
               );
}

Assistant:

VmValue* CompileVmMemberAccess(ExpressionContext &ctx, VmModule *module, ExprMemberAccess *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	assert(isType<TypeRef>(node->value->type));

	VmValue *offset = CreateConstantInt(module->allocator, node->source, node->member->variable->offset);

	return CheckType(ctx, node, CreateMemberAccess(module, node->source, value, offset, ctx.GetReferenceType(node->member->variable->type), node->member->variable->name->name));
}